

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult access_pauth(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint uVar2;
  uint64_t uVar3;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 != 0) {
      uVar2 = env->pstate >> 2 & 3;
      if (1 < uVar2) {
        if ((uVar1 >> 0x21 & 1) == 0 || uVar2 != 2) {
          return CP_ACCESS_OK;
        }
        goto LAB_0061d72b;
      }
      goto LAB_0061d706;
    }
    uVar2 = env->uncached_cpsr & 0x1f;
    if (uVar2 == 0x10) goto LAB_0061d706;
    if (uVar2 == 0x16) {
      return CP_ACCESS_OK;
    }
    if (uVar2 != 0x1a) {
      if ((uVar1 >> 0x21 & 1) != 0) {
        if (uVar2 == 0x16) {
          if (((uint)uVar1 >> 0x1c & 1) == 0) {
            return CP_ACCESS_OK;
          }
        }
        else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
          return CP_ACCESS_OK;
        }
      }
      goto LAB_0061d706;
    }
  }
  else {
LAB_0061d706:
    if (((uVar1 >> 0x20 & 1) != 0) &&
       (uVar3 = arm_hcr_el2_eff_aarch64(env), (uVar3 >> 0x28 & 1) == 0)) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  if ((uVar1 >> 0x21 & 1) == 0) {
    return CP_ACCESS_OK;
  }
LAB_0061d72b:
  if (((env->cp15).scr_el3 & 0x10000) != 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static CPAccessResult access_pauth(CPUARMState *env, const ARMCPRegInfo *ri,
                                   bool isread)
{
    int el = arm_current_el(env);

    if (el < 2 &&
        arm_feature(env, ARM_FEATURE_EL2) &&
        !(arm_hcr_el2_eff(env) & HCR_APK)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 &&
        arm_feature(env, ARM_FEATURE_EL3) &&
        !(env->cp15.scr_el3 & SCR_APK)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}